

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hiredis.c
# Opt level: O3

int redisvFormatCommand(char **target,char *format,__va_list_tag *ap)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  sds pcVar5;
  sds pcVar6;
  undefined8 *puVar7;
  size_t *psVar8;
  ushort **ppuVar9;
  size_t sVar10;
  void *pvVar11;
  size_t sVar12;
  char *pcVar13;
  ulong uVar14;
  void *__ptr;
  char *pcVar15;
  ulong uVar16;
  int iVar17;
  byte bVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  va_list _cpy;
  char _format [16];
  __va_list_tag local_68;
  char local_48;
  char acStack_47 [23];
  
  if (target == (char **)0x0) {
    return -1;
  }
  pcVar5 = sdsempty();
  if (pcVar5 == (sds)0x0) {
    return -1;
  }
  bVar2 = false;
  __ptr = (void *)0x0;
  uVar20 = 0;
  iVar17 = 0;
LAB_00104f77:
  cVar1 = *format;
  if (cVar1 != ' ') {
    if (cVar1 == '%') {
      bVar18 = format[1];
      pcVar6 = pcVar5;
      if (bVar18 < 0x62) {
        if (bVar18 == 0) goto LAB_00104f8d;
        if (bVar18 == 0x25) {
          pcVar6 = sdscat(pcVar5,"%");
          goto LAB_00105311;
        }
LAB_00105096:
        pcVar13 = format + 1;
        pcVar15 = format + 2;
        do {
          pvVar11 = memchr("#0-+ ",(int)(char)bVar18,6);
          if (pvVar11 == (void *)0x0) {
            if (bVar18 != 0) {
              ppuVar9 = __ctype_b_loc();
              goto LAB_00105126;
            }
            break;
          }
          bVar18 = pcVar13[1];
          pcVar13 = pcVar13 + 1;
          pcVar15 = pcVar15 + 1;
        } while (bVar18 != 0);
        goto LAB_0010522e;
      }
      if (bVar18 == 0x62) {
        uVar21 = ap->gp_offset;
        uVar16 = (ulong)uVar21;
        if (uVar16 < 0x29) {
          ap->gp_offset = (uint)(uVar16 + 8);
          pvVar11 = *(void **)((long)ap->reg_save_area + uVar16);
          if (0x20 < uVar21) goto LAB_001051cd;
          psVar8 = (size_t *)(uVar16 + 8 + (long)ap->reg_save_area);
          ap->gp_offset = uVar21 + 0x10;
        }
        else {
          puVar7 = (undefined8 *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar7 + 1;
          pvVar11 = (void *)*puVar7;
LAB_001051cd:
          psVar8 = (size_t *)ap->overflow_arg_area;
          ap->overflow_arg_area = psVar8 + 1;
        }
        if (*psVar8 != 0) {
          pcVar6 = sdscatlen(pcVar5,pvVar11,*psVar8);
        }
      }
      else {
        if (bVar18 != 0x73) goto LAB_00105096;
        uVar21 = ap->gp_offset;
        if ((ulong)uVar21 < 0x29) {
          puVar7 = (undefined8 *)((ulong)uVar21 + (long)ap->reg_save_area);
          ap->gp_offset = uVar21 + 8;
        }
        else {
          puVar7 = (undefined8 *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar7 + 1;
        }
        pcVar13 = (char *)*puVar7;
        sVar10 = strlen(pcVar13);
        if (sVar10 != 0) {
          pcVar6 = sdscatlen(pcVar5,pcVar13,sVar10);
        }
      }
      goto LAB_00105311;
    }
    if (cVar1 == '\0') {
      if (bVar2) {
        lVar22 = (long)(int)uVar20;
        pvVar11 = realloc(__ptr,lVar22 * 8 + 8);
        if (pvVar11 == (void *)0x0) {
          iVar17 = -1;
          goto LAB_001056ee;
        }
        *(sds *)((long)pvVar11 + lVar22 * 8) = pcVar5;
        switch(pcVar5[-1] & 7) {
        case 0:
          sVar12 = (size_t)((byte)pcVar5[-1] >> 3);
          break;
        case 1:
          sVar12 = (size_t)(byte)pcVar5[-3];
          break;
        case 2:
          sVar12 = (size_t)*(ushort *)(pcVar5 + -5);
          break;
        case 3:
          sVar12 = (size_t)*(uint *)(pcVar5 + -9);
          break;
        case 4:
          sVar12 = *(size_t *)(pcVar5 + -0x11);
          break;
        default:
          sVar12 = 0;
        }
        uVar20 = uVar20 + 1;
        uVar16 = lVar22 + 1;
        sVar12 = bulklen(sVar12);
        iVar17 = iVar17 + (int)sVar12;
        __ptr = pvVar11;
      }
      else {
        sdsfree(pcVar5);
        uVar16 = (ulong)(int)uVar20;
      }
      iVar19 = 1;
      if (uVar20 < 10) goto LAB_00105558;
      iVar4 = 4;
      goto LAB_00105517;
    }
LAB_00104f8d:
    pcVar6 = sdscatlen(pcVar5,format,1);
    if (pcVar6 != (sds)0x0) {
      pcVar5 = pcVar6;
      bVar3 = true;
      goto LAB_00105323;
    }
    goto LAB_0010540a;
  }
  bVar3 = false;
  if (bVar2) {
    pvVar11 = realloc(__ptr,(long)(int)uVar20 * 8 + 8);
    if (pvVar11 != (void *)0x0) {
      *(sds *)((long)pvVar11 + (long)(int)uVar20 * 8) = pcVar5;
      switch(pcVar5[-1] & 7) {
      case 0:
        sVar12 = (size_t)((byte)pcVar5[-1] >> 3);
        break;
      case 1:
        sVar12 = (size_t)(byte)pcVar5[-3];
        break;
      case 2:
        sVar12 = (size_t)*(ushort *)(pcVar5 + -5);
        break;
      case 3:
        sVar12 = (size_t)*(uint *)(pcVar5 + -9);
        break;
      case 4:
        sVar12 = *(size_t *)(pcVar5 + -0x11);
        break;
      default:
        sVar12 = 0;
      }
      uVar20 = uVar20 + 1;
      sVar12 = bulklen(sVar12);
      pcVar5 = sdsempty();
      if (pcVar5 != (sds)0x0) {
        iVar17 = iVar17 + (int)sVar12;
        __ptr = pvVar11;
        goto LAB_00105323;
      }
      iVar17 = -1;
      pcVar5 = (sds)0x0;
      goto LAB_001056f3;
    }
    iVar17 = -1;
    goto LAB_001056ee;
  }
  goto LAB_00105323;
  while( true ) {
    bVar18 = pcVar13[1];
    pcVar13 = pcVar13 + 1;
    pcVar15 = pcVar15 + 1;
    if (bVar18 == 0) break;
LAB_00105126:
    if ((*(byte *)((long)*ppuVar9 + (long)(char)bVar18 * 2 + 1) & 8) == 0) {
      if (bVar18 == 0x2e) goto LAB_00105216;
      break;
    }
  }
  goto LAB_0010522e;
  while (pcVar15 = pcVar13 + 1, (*(byte *)((long)*ppuVar9 + (long)*pcVar13 * 2 + 1) & 8) != 0) {
LAB_00105216:
    pcVar13 = pcVar15;
    if ((long)*pcVar13 == 0) break;
  }
LAB_0010522e:
  local_68.reg_save_area = ap->reg_save_area;
  local_68.gp_offset = ap->gp_offset;
  local_68.fp_offset = ap->fp_offset;
  local_68.overflow_arg_area = ap->overflow_arg_area;
  cVar1 = *pcVar13;
  pvVar11 = memchr("diouxX",(int)cVar1,7);
  if (pvVar11 == (void *)0x0) {
    pvVar11 = memchr("eEfFgGaA",(int)cVar1,9);
    if (pvVar11 == (void *)0x0) {
      if (cVar1 == 'l') {
        cVar1 = pcVar13[1];
        if (cVar1 != 'l') goto joined_r0x00105379;
        cVar1 = pcVar13[2];
joined_r0x001053b3:
        if ((cVar1 == '\0') || (pvVar11 = memchr("diouxX",(int)cVar1,7), pvVar11 == (void *)0x0))
        goto LAB_001054ac;
        pcVar13 = pcVar13 + 2;
      }
      else {
        if (cVar1 != 'h') goto LAB_001054ac;
        cVar1 = pcVar13[1];
        if (cVar1 == 'h') {
          cVar1 = pcVar13[2];
          goto joined_r0x001053b3;
        }
joined_r0x00105379:
        if ((cVar1 == '\0') || (pvVar11 = memchr("diouxX",(int)cVar1,7), pvVar11 == (void *)0x0)) {
LAB_001054ac:
          iVar17 = -2;
          goto LAB_001056ee;
        }
        pcVar13 = pcVar13 + 1;
      }
      if (ap->gp_offset < 0x29) {
        ap->gp_offset = ap->gp_offset + 8;
      }
      else {
        ap->overflow_arg_area = (void *)((long)ap->overflow_arg_area + 8);
      }
    }
    else if (ap->fp_offset < 0xa1) {
      ap->fp_offset = ap->fp_offset + 0x10;
    }
    else {
      ap->overflow_arg_area = (void *)((long)ap->overflow_arg_area + 8);
    }
  }
  else if (ap->gp_offset < 0x29) {
    ap->gp_offset = ap->gp_offset + 8;
  }
  else {
    ap->overflow_arg_area = (void *)((long)ap->overflow_arg_area + 8);
  }
  pcVar15 = pcVar13 + (1 - (long)format);
  if (pcVar15 < (char *)0xe) {
    memcpy(&local_48,format,(size_t)pcVar15);
    acStack_47[(long)(pcVar15 + -1)] = '\0';
    pcVar6 = sdscatvprintf(pcVar5,&local_48,&local_68);
    format = pcVar13 + -1;
  }
LAB_00105311:
  if (pcVar6 == (sds)0x0) goto LAB_0010540a;
  format = format + 1;
  pcVar5 = pcVar6;
  bVar3 = true;
LAB_00105323:
  bVar2 = bVar3;
  format = format + 1;
  goto LAB_00104f77;
LAB_0010540a:
  iVar17 = -1;
  goto LAB_001056ee;
  while( true ) {
    if (uVar16 < 10000) goto LAB_00105558;
    bVar2 = uVar16 < 100000;
    uVar16 = uVar16 / 10000;
    iVar4 = iVar19 + 4;
    if (bVar2) break;
LAB_00105517:
    iVar19 = iVar4;
    if (uVar16 < 100) {
      iVar19 = iVar19 + -2;
      goto LAB_00105558;
    }
    if (uVar16 < 1000) {
      iVar19 = iVar19 + -1;
      goto LAB_00105558;
    }
  }
  iVar19 = iVar19 + 1;
LAB_00105558:
  pcVar13 = (char *)malloc((long)(iVar19 + iVar17 + 4));
  if (pcVar13 != (char *)0x0) {
    iVar17 = iVar19 + iVar17 + 3;
    iVar19 = sprintf(pcVar13,"*%d\r\n",(ulong)uVar20);
    if (0 < (int)uVar20) {
      uVar16 = 0;
      do {
        lVar22 = *(long *)((long)__ptr + uVar16 * 8);
        switch(*(byte *)(lVar22 + -1) & 7) {
        case 0:
          uVar14 = (ulong)(*(byte *)(lVar22 + -1) >> 3);
          break;
        case 1:
          uVar14 = (ulong)*(byte *)(lVar22 + -3);
          break;
        case 2:
          uVar14 = (ulong)*(ushort *)(lVar22 + -5);
          break;
        case 3:
          uVar14 = (ulong)*(uint *)(lVar22 + -9);
          break;
        case 4:
          uVar14 = *(ulong *)(lVar22 + -0x11);
          break;
        default:
          uVar14 = 0;
        }
        iVar4 = sprintf(pcVar13 + iVar19,"$%zu\r\n",uVar14);
        pvVar11 = *(void **)((long)__ptr + uVar16 * 8);
        switch(*(byte *)((long)pvVar11 + -1) & 7) {
        case 0:
          sVar10 = (size_t)(*(byte *)((long)pvVar11 + -1) >> 3);
          break;
        case 1:
          sVar10 = (size_t)*(byte *)((long)pvVar11 + -3);
          break;
        case 2:
          sVar10 = (size_t)*(ushort *)((long)pvVar11 + -5);
          break;
        case 3:
          sVar10 = (size_t)*(uint *)((long)pvVar11 + -9);
          break;
        case 4:
          sVar10 = *(size_t *)((long)pvVar11 + -0x11);
          break;
        default:
          sVar10 = 0;
        }
        iVar4 = iVar4 + iVar19;
        memcpy(pcVar13 + iVar4,pvVar11,sVar10);
        pcVar5 = *(sds *)((long)__ptr + uVar16 * 8);
        switch(pcVar5[-1] & 7) {
        case 0:
          uVar21 = (uint)((byte)pcVar5[-1] >> 3);
          break;
        case 1:
          uVar21 = (uint)(byte)pcVar5[-3];
          break;
        case 2:
          uVar21 = (uint)*(ushort *)(pcVar5 + -5);
          break;
        case 3:
          uVar21 = *(uint *)(pcVar5 + -9);
          break;
        case 4:
          uVar21 = (uint)*(undefined8 *)(pcVar5 + -0x11);
          break;
        default:
          uVar21 = 0;
        }
        sdsfree(pcVar5);
        (pcVar13 + (int)(uVar21 + iVar4))[0] = '\r';
        (pcVar13 + (int)(uVar21 + iVar4))[1] = '\n';
        iVar19 = uVar21 + iVar4 + 2;
        uVar16 = uVar16 + 1;
      } while (uVar20 != uVar16);
    }
    if (iVar19 == iVar17) {
      pcVar13[iVar17] = '\0';
      free(__ptr);
      *target = pcVar13;
      return iVar17;
    }
    __assert_fail("pos == totlen",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/hiredis.c"
                  ,0x1e5,"int redisvFormatCommand(char **, const char *, struct __va_list_tag *)");
  }
  iVar17 = -1;
  pcVar5 = (sds)0x0;
LAB_001056ee:
  pvVar11 = __ptr;
  if (__ptr != (void *)0x0) {
LAB_001056f3:
    if (uVar20 != 0) {
      lVar22 = (long)(int)uVar20;
      do {
        sdsfree(*(sds *)((long)pvVar11 + lVar22 * 8 + -8));
        lVar22 = lVar22 + -1;
      } while (lVar22 != 0);
    }
    free(pvVar11);
  }
  sdsfree(pcVar5);
  return iVar17;
}

Assistant:

int redisvFormatCommand(char **target, const char *format, va_list ap) {
    const char *c = format;
    char *cmd = NULL; /* final command */
    int pos; /* position in final command */
    sds curarg, newarg; /* current argument */
    int touched = 0; /* was the current argument touched? */
    char **curargv = NULL, **newargv = NULL;
    int argc = 0;
    int totlen = 0;
    int error_type = 0; /* 0 = no error; -1 = memory error; -2 = format error */
    int j;

    /* Abort if there is not target to set */
    if (target == NULL)
        return -1;

    /* Build the command string accordingly to protocol */
    curarg = sdsempty();
    if (curarg == NULL)
        return -1;

    while(*c != '\0') {
        if (*c != '%' || c[1] == '\0') {
            if (*c == ' ') {
                if (touched) {
                    newargv = realloc(curargv,sizeof(char*)*(argc+1));
                    if (newargv == NULL) goto memory_err;
                    curargv = newargv;
                    curargv[argc++] = curarg;
                    totlen += bulklen(sdslen(curarg));

                    /* curarg is put in argv so it can be overwritten. */
                    curarg = sdsempty();
                    if (curarg == NULL) goto memory_err;
                    touched = 0;
                }
            } else {
                newarg = sdscatlen(curarg,c,1);
                if (newarg == NULL) goto memory_err;
                curarg = newarg;
                touched = 1;
            }
        } else {
            char *arg;
            size_t size;

            /* Set newarg so it can be checked even if it is not touched. */
            newarg = curarg;

            switch(c[1]) {
            case 's':
                arg = va_arg(ap,char*);
                size = strlen(arg);
                if (size > 0)
                    newarg = sdscatlen(curarg,arg,size);
                break;
            case 'b':
                arg = va_arg(ap,char*);
                size = va_arg(ap,size_t);
                if (size > 0)
                    newarg = sdscatlen(curarg,arg,size);
                break;
            case '%':
                newarg = sdscat(curarg,"%");
                break;
            default:
                /* Try to detect printf format */
                {
                    static const char intfmts[] = "diouxX";
                    static const char flags[] = "#0-+ ";
                    char _format[16];
                    const char *_p = c+1;
                    size_t _l = 0;
                    va_list _cpy;

                    /* Flags */
                    while (*_p != '\0' && strchr(flags,*_p) != NULL) _p++;

                    /* Field width */
                    while (*_p != '\0' && isdigit(*_p)) _p++;

                    /* Precision */
                    if (*_p == '.') {
                        _p++;
                        while (*_p != '\0' && isdigit(*_p)) _p++;
                    }

                    /* Copy va_list before consuming with va_arg */
                    va_copy(_cpy,ap);

                    /* Integer conversion (without modifiers) */
                    if (strchr(intfmts,*_p) != NULL) {
                        va_arg(ap,int);
                        goto fmt_valid;
                    }

                    /* Double conversion (without modifiers) */
                    if (strchr("eEfFgGaA",*_p) != NULL) {
                        va_arg(ap,double);
                        goto fmt_valid;
                    }

                    /* Size: char */
                    if (_p[0] == 'h' && _p[1] == 'h') {
                        _p += 2;
                        if (*_p != '\0' && strchr(intfmts,*_p) != NULL) {
                            va_arg(ap,int); /* char gets promoted to int */
                            goto fmt_valid;
                        }
                        goto fmt_invalid;
                    }

                    /* Size: short */
                    if (_p[0] == 'h') {
                        _p += 1;
                        if (*_p != '\0' && strchr(intfmts,*_p) != NULL) {
                            va_arg(ap,int); /* short gets promoted to int */
                            goto fmt_valid;
                        }
                        goto fmt_invalid;
                    }

                    /* Size: long long */
                    if (_p[0] == 'l' && _p[1] == 'l') {
                        _p += 2;
                        if (*_p != '\0' && strchr(intfmts,*_p) != NULL) {
                            va_arg(ap,long long);
                            goto fmt_valid;
                        }
                        goto fmt_invalid;
                    }

                    /* Size: long */
                    if (_p[0] == 'l') {
                        _p += 1;
                        if (*_p != '\0' && strchr(intfmts,*_p) != NULL) {
                            va_arg(ap,long);
                            goto fmt_valid;
                        }
                        goto fmt_invalid;
                    }

                fmt_invalid:
                    va_end(_cpy);
                    goto format_err;

                fmt_valid:
                    _l = (_p+1)-c;
                    if (_l < sizeof(_format)-2) {
                        memcpy(_format,c,_l);
                        _format[_l] = '\0';
                        newarg = sdscatvprintf(curarg,_format,_cpy);

                        /* Update current position (note: outer blocks
                         * increment c twice so compensate here) */
                        c = _p-1;
                    }

                    va_end(_cpy);
                    break;
                }
            }

            if (newarg == NULL) goto memory_err;
            curarg = newarg;

            touched = 1;
            c++;
        }
        c++;
    }

    /* Add the last argument if needed */
    if (touched) {
        newargv = realloc(curargv,sizeof(char*)*(argc+1));
        if (newargv == NULL) goto memory_err;
        curargv = newargv;
        curargv[argc++] = curarg;
        totlen += bulklen(sdslen(curarg));
    } else {
        sdsfree(curarg);
    }

    /* Clear curarg because it was put in curargv or was free'd. */
    curarg = NULL;

    /* Add bytes needed to hold multi bulk count */
    totlen += 1+countDigits(argc)+2;

    /* Build the command at protocol level */
    cmd = malloc(totlen+1);
    if (cmd == NULL) goto memory_err;

    pos = sprintf(cmd,"*%d\r\n",argc);
    for (j = 0; j < argc; j++) {
        pos += sprintf(cmd+pos,"$%zu\r\n",sdslen(curargv[j]));
        memcpy(cmd+pos,curargv[j],sdslen(curargv[j]));
        pos += sdslen(curargv[j]);
        sdsfree(curargv[j]);
        cmd[pos++] = '\r';
        cmd[pos++] = '\n';
    }
    assert(pos == totlen);
    cmd[pos] = '\0';

    free(curargv);
    *target = cmd;
    return totlen;

format_err:
    error_type = -2;
    goto cleanup;

memory_err:
    error_type = -1;
    goto cleanup;

cleanup:
    if (curargv) {
        while(argc--)
            sdsfree(curargv[argc]);
        free(curargv);
    }

    sdsfree(curarg);
    free(cmd);

    return error_type;
}